

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Message __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::Elements
          (UnorderedElementsAreMatcherImplBase *this,size_t n)

{
  Message *msg;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  char *local_20;
  
  Message::Message((Message *)&local_28);
  std::ostream::_M_insert<unsigned_long>((ulong)(local_28.ptr_ + 0x10));
  std::operator<<((ostream *)(local_28.ptr_ + 0x10)," element");
  local_20 = "s";
  if (n == 1) {
    local_20 = "";
  }
  msg = Message::operator<<((Message *)&local_28,&local_20);
  Message::Message((Message *)this,msg);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
  return (Message)(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )this;
}

Assistant:

static Message Elements(size_t n) {
    return Message() << n << " element" << (n == 1 ? "" : "s");
  }